

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveTree.cpp
# Opt level: O2

void glslang::RemoveAllTreeNodes(TIntermNode *root)

{
  TRemoveTraverser TStack_48;
  
  TRemoveTraverser::TRemoveTraverser(&TStack_48);
  (*root->_vptr_TIntermNode[2])(root,&TStack_48);
  return;
}

Assistant:

void RemoveAllTreeNodes(TIntermNode* root)
{
    TRemoveTraverser it;

    root->traverse(&it);
}